

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# czmap.c
# Opt level: O1

czmap_copy_status czmap_copy(czmap *src,czmap *dst)

{
  czmap_inserter_data idata;
  czmap *local_18;
  char local_10;
  
  local_10 = '\0';
  local_18 = dst;
  czmap_foreach(src,czmap_internal_inserter,&local_18);
  return (czmap_copy_status)(local_10 != '\0');
}

Assistant:

czmap_copy_status czmap_copy(czmap * src, czmap * dst) {
    czmap_inserter_data idata;
    idata.dst = dst;
    idata.nospace = 0;

    /* inserter will find space. idata.nospace will be = 1 if
     * it failed somewhere */
    czmap_foreach(src, czmap_internal_inserter, &idata);

    if (idata.nospace == 0) return CZMAP_COPY_OK;
    else return CZMAP_COPY_NOSPACE;
}